

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void RemoveAllFilesInList(void)

{
  NameListEntry *pNVar1;
  NameListEntry *Next;
  
  while (FileNameList != (NameListEntry *)0x0) {
    pNVar1 = FileNameList->Next;
    fprintf(_stderr,"SST stream open at exit, unlinking contact file %s\n",FileNameList->FileName);
    unlink(FileNameList->FileName);
    free(FileNameList);
    FileNameList = pNVar1;
  }
  return;
}

Assistant:

static void RemoveAllFilesInList(void)
{
    while (FileNameList)
    {
        struct NameListEntry *Next = FileNameList->Next;
        fprintf(stderr, "SST stream open at exit, unlinking contact file %s\n",
                FileNameList->FileName);
        unlink(FileNameList->FileName);
        free(FileNameList);
        FileNameList = Next;
    }
}